

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O0

void __thiscall imrt::Station::~Station(Station *this)

{
  Station *in_RDI;
  
  ~Station(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Station(){ }